

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_archive_write_set_format_by_name.c
# Opt level: O0

void test_format_by_name(char *format_name,char *compression_type,int format_id,int dot_stored,
                        void *image,size_t image_size)

{
  int iVar1;
  mode_t mVar2;
  void *buff_00;
  time_t tVar3;
  char *pcVar4;
  la_ssize_t v2;
  la_int64_t v2_00;
  long v1;
  int r;
  char *buff;
  size_t buffsize;
  size_t used;
  archive *a;
  archive_entry *ae;
  size_t image_size_local;
  void *image_local;
  int dot_stored_local;
  int format_id_local;
  char *compression_type_local;
  char *format_name_local;
  
  ae = (archive_entry *)image_size;
  image_size_local = (size_t)image;
  image_local._0_4_ = dot_stored;
  image_local._4_4_ = format_id;
  _dot_stored_local = compression_type;
  compression_type_local = format_name;
  buff_00 = malloc(0x100000);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_archive_write_set_format_by_name.c"
                   ,L'\'',(uint)(buff_00 != (void *)0x0),"(buff = malloc(buffsize)) != NULL",
                   (void *)0x0);
  if (buff_00 != (void *)0x0) {
    used = (size_t)archive_write_new();
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_archive_write_set_format_by_name.c"
                     ,L',',(uint)((archive *)used != (archive *)0x0),
                     "(a = archive_write_new()) != NULL",(void *)0x0);
    iVar1 = archive_write_set_format_by_name((archive *)used,compression_type_local);
    if (iVar1 == -0x14) {
      skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_archive_write_set_format_by_name.c"
                     ,L'/');
      test_skipping("%s format not fully supported on this platform",_dot_stored_local);
      iVar1 = archive_write_free((archive *)used);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_archive_write_set_format_by_name.c"
                          ,L'1',0,"ARCHIVE_OK",(long)iVar1,"archive_write_free(a)",(void *)0x0);
      free(buff_00);
    }
    else {
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_archive_write_set_format_by_name.c"
                          ,L'5',0,"ARCHIVE_OK",(long)iVar1,"r",(void *)used);
      if ((_dot_stored_local == (char *)0x0) ||
         (iVar1 = archive_write_set_format_option
                            ((archive *)used,compression_type_local,"compression",_dot_stored_local)
         , iVar1 == 0)) {
        iVar1 = archive_write_add_filter_none((archive *)used);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_archive_write_set_format_by_name.c"
                            ,L'?',0,"ARCHIVE_OK",(long)iVar1,"archive_write_add_filter_none(a)",
                            (void *)used);
        iVar1 = archive_write_open_memory((archive *)used,buff_00,0x100000,&buffsize);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_archive_write_set_format_by_name.c"
                            ,L'A',0,"ARCHIVE_OK",(long)iVar1,
                            "archive_write_open_memory(a, buff, buffsize, &used)",(void *)used);
        a = (archive *)archive_entry_new();
        assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_archive_write_set_format_by_name.c"
                         ,L'F',(uint)((archive_entry *)a != (archive_entry *)0x0),
                         "(ae = archive_entry_new()) != NULL",(void *)0x0);
        archive_entry_set_mtime((archive_entry *)a,1,0);
        tVar3 = archive_entry_mtime((archive_entry *)a);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_archive_write_set_format_by_name.c"
                            ,L'H',1,"1",tVar3,"archive_entry_mtime(ae)",(void *)0x0);
        archive_entry_set_ctime((archive_entry *)a,1,0);
        tVar3 = archive_entry_ctime((archive_entry *)a);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_archive_write_set_format_by_name.c"
                            ,L'J',1,"1",tVar3,"archive_entry_ctime(ae)",(void *)0x0);
        archive_entry_set_atime((archive_entry *)a,1,0);
        tVar3 = archive_entry_atime((archive_entry *)a);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_archive_write_set_format_by_name.c"
                            ,L'L',1,"1",tVar3,"archive_entry_atime(ae)",(void *)0x0);
        archive_entry_copy_pathname((archive_entry *)a,"file");
        pcVar4 = archive_entry_pathname((archive_entry *)a);
        assertion_equal_string
                  ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_archive_write_set_format_by_name.c"
                   ,L'N',"file","\"file\"",pcVar4,"archive_entry_pathname(ae)",(void *)0x0,L'\0');
        archive_entry_set_mode((archive_entry *)a,0x81ed);
        mVar2 = archive_entry_mode((archive_entry *)a);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_archive_write_set_format_by_name.c"
                            ,L'P',0x81ed,"(AE_IFREG | 0755)",(ulong)mVar2,"archive_entry_mode(ae)",
                            (void *)0x0);
        archive_entry_set_size((archive_entry *)a,8);
        iVar1 = archive_write_header((archive *)used,(archive_entry *)a);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_archive_write_set_format_by_name.c"
                            ,L'R',0,"0",(long)iVar1,"archive_write_header(a, ae)",(void *)0x0);
        archive_entry_free((archive_entry *)a);
        v2 = archive_write_data((archive *)used,"12345678",8);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_archive_write_set_format_by_name.c"
                            ,L'T',8,"8",v2,"archive_write_data(a, \"12345678\", 8)",(void *)0x0);
        iVar1 = archive_write_close((archive *)used);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_archive_write_set_format_by_name.c"
                            ,L'W',0,"ARCHIVE_OK",(long)iVar1,"archive_write_close(a)",(void *)used);
        iVar1 = archive_write_free((archive *)used);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_archive_write_set_format_by_name.c"
                            ,L'X',0,"ARCHIVE_OK",(long)iVar1,"archive_write_free(a)",(void *)0x0);
        if ((image_size_local != 0) && (ae != (archive_entry *)0x0)) {
          assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_archive_write_set_format_by_name.c"
                              ,L'[',buff_00,"buff",(void *)image_size_local,"image",(size_t)ae,
                              "image_size",(void *)0x0);
        }
        if (0 < image_local._4_4_) {
          used = (size_t)archive_read_new();
          assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_archive_write_set_format_by_name.c"
                           ,L'b',(uint)((archive *)used != (archive *)0x0),
                           "(a = archive_read_new()) != NULL",(void *)0x0);
          iVar1 = archive_read_support_format_all((archive *)used);
          assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_archive_write_set_format_by_name.c"
                              ,L'd',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_format_all(a)",
                              (void *)used);
          iVar1 = archive_read_support_filter_all((archive *)used);
          assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_archive_write_set_format_by_name.c"
                              ,L'f',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_filter_all(a)",
                              (void *)used);
          iVar1 = read_open_memory_seek((archive *)used,buff_00,buffsize,7);
          assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_archive_write_set_format_by_name.c"
                              ,L'h',0,"ARCHIVE_OK",(long)iVar1,
                              "read_open_memory_seek(a, buff, used, 7)",(void *)used);
          if (((uint)image_local & 1) != 0) {
            iVar1 = archive_read_next_header((archive *)used,(archive_entry **)&a);
            assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_archive_write_set_format_by_name.c"
                                ,L'l',0,"ARCHIVE_OK",(long)iVar1,"archive_read_next_header(a, &ae)",
                                (void *)used);
            pcVar4 = archive_entry_pathname((archive_entry *)a);
            assertion_equal_string
                      ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_archive_write_set_format_by_name.c"
                       ,L'm',".","\".\"",pcVar4,"archive_entry_pathname(ae)",(void *)0x0,L'\0');
            mVar2 = archive_entry_filetype((archive_entry *)a);
            assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_archive_write_set_format_by_name.c"
                                ,L'n',0x4000,"AE_IFDIR",(ulong)mVar2,"archive_entry_filetype(ae)",
                                (void *)0x0);
          }
          iVar1 = archive_read_next_header((archive *)used,(archive_entry **)&a);
          assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_archive_write_set_format_by_name.c"
                              ,L's',0,"ARCHIVE_OK",(long)iVar1,"archive_read_next_header(a, &ae)",
                              (void *)used);
          tVar3 = archive_entry_mtime((archive_entry *)a);
          assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_archive_write_set_format_by_name.c"
                              ,L't',1,"1",tVar3,"archive_entry_mtime(ae)",(void *)0x0);
          if (((uint)image_local & 2) == 0) {
            pcVar4 = archive_entry_pathname((archive_entry *)a);
            assertion_equal_string
                      ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_archive_write_set_format_by_name.c"
                       ,L'x',"file","\"file\"",pcVar4,"archive_entry_pathname(ae)",(void *)0x0,L'\0'
                      );
          }
          else {
            pcVar4 = archive_entry_pathname((archive_entry *)a);
            assertion_equal_string
                      ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_archive_write_set_format_by_name.c"
                       ,L'v',"./file","\"./file\"",pcVar4,"archive_entry_pathname(ae)",(void *)0x0,
                       L'\0');
          }
          mVar2 = archive_entry_filetype((archive_entry *)a);
          assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_archive_write_set_format_by_name.c"
                              ,L'z',0x8000,"AE_IFREG",(ulong)mVar2,"archive_entry_filetype(ae)",
                              (void *)0x0);
          v2_00 = archive_entry_size((archive_entry *)a);
          assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_archive_write_set_format_by_name.c"
                              ,L'{',8,"8",v2_00,"archive_entry_size(ae)",(void *)0x0);
          iVar1 = archive_read_next_header((archive *)used,(archive_entry **)&a);
          assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_archive_write_set_format_by_name.c"
                              ,L'~',1,"ARCHIVE_EOF",(long)iVar1,"archive_read_next_header(a, &ae)",
                              (void *)used);
          iVar1 = archive_filter_code((archive *)used,0);
          assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_archive_write_set_format_by_name.c"
                              ,L'\x82',0,"ARCHIVE_FILTER_NONE",(long)iVar1,
                              "archive_filter_code(a, 0)",(void *)used);
          v1 = (long)image_local._4_4_;
          iVar1 = archive_format((archive *)used);
          assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_archive_write_set_format_by_name.c"
                              ,L'\x83',v1,"format_id",(long)iVar1,"archive_format(a)",(void *)used);
          iVar1 = archive_read_close((archive *)used);
          assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_archive_write_set_format_by_name.c"
                              ,L'\x85',0,"ARCHIVE_OK",(long)iVar1,"archive_read_close(a)",
                              (void *)0x0);
          iVar1 = archive_read_free((archive *)used);
          assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_archive_write_set_format_by_name.c"
                              ,L'\x86',0,"ARCHIVE_OK",(long)iVar1,"archive_read_free(a)",(void *)0x0
                             );
        }
        free(buff_00);
      }
      else {
        skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_archive_write_set_format_by_name.c"
                       ,L'9');
        test_skipping("%s writing not fully supported on this platform",_dot_stored_local);
        iVar1 = archive_write_free((archive *)used);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_archive_write_set_format_by_name.c"
                            ,L';',0,"ARCHIVE_OK",(long)iVar1,"archive_write_free(a)",(void *)0x0);
        free(buff_00);
      }
    }
  }
  return;
}

Assistant:

static void
test_format_by_name(const char *format_name, const char *compression_type,
    int format_id, int dot_stored, const void *image, size_t image_size)
{
	struct archive_entry *ae;
	struct archive *a;
	size_t used;
	size_t buffsize = 1024 * 1024;
	char *buff;
	int r;

	assert((buff = malloc(buffsize)) != NULL);
	if (buff == NULL)
		return;

	/* Create a new archive in memory. */
	assert((a = archive_write_new()) != NULL);
	r = archive_write_set_format_by_name(a, format_name);
	if (r == ARCHIVE_WARN) {
		skipping("%s format not fully supported on this platform",
		   compression_type);
		assertEqualInt(ARCHIVE_OK, archive_write_free(a));
		free(buff);
		return;
	}
	assertEqualIntA(a, ARCHIVE_OK, r);
	if (compression_type != NULL &&
	    ARCHIVE_OK != archive_write_set_format_option(a, format_name,
	    "compression", compression_type)) {
		skipping("%s writing not fully supported on this platform",
		   compression_type);
		assertEqualInt(ARCHIVE_OK, archive_write_free(a));
		free(buff);
		return;
	}
	assertEqualIntA(a, ARCHIVE_OK, archive_write_add_filter_none(a));
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_write_open_memory(a, buff, buffsize, &used));

	/*
	 * Write a file to it.
	 */
	assert((ae = archive_entry_new()) != NULL);
	archive_entry_set_mtime(ae, 1, 0);
	assertEqualInt(1, archive_entry_mtime(ae));
	archive_entry_set_ctime(ae, 1, 0);
	assertEqualInt(1, archive_entry_ctime(ae));
	archive_entry_set_atime(ae, 1, 0);
	assertEqualInt(1, archive_entry_atime(ae));
	archive_entry_copy_pathname(ae, "file");
	assertEqualString("file", archive_entry_pathname(ae));
	archive_entry_set_mode(ae, AE_IFREG | 0755);
	assertEqualInt((AE_IFREG | 0755), archive_entry_mode(ae));
	archive_entry_set_size(ae, 8);
	assertEqualInt(0, archive_write_header(a, ae));
	archive_entry_free(ae);
	assertEqualInt(8, archive_write_data(a, "12345678", 8));

	/* Close out the archive. */
	assertEqualIntA(a, ARCHIVE_OK, archive_write_close(a));
	assertEqualInt(ARCHIVE_OK, archive_write_free(a));

	if (image && image_size > 0) {
		assertEqualMem(buff, image, image_size);
	}
	if (format_id > 0) {
		/*
		 * Now, read the data back.
		 */
		/* With the test memory reader -- seeking mode. */
		assert((a = archive_read_new()) != NULL);
		assertEqualIntA(a, ARCHIVE_OK,
		    archive_read_support_format_all(a));
		assertEqualIntA(a, ARCHIVE_OK,
		    archive_read_support_filter_all(a));
		assertEqualIntA(a, ARCHIVE_OK,
		    read_open_memory_seek(a, buff, used, 7));

		if (dot_stored & 1) {
			assertEqualIntA(a, ARCHIVE_OK,
			    archive_read_next_header(a, &ae));
			assertEqualString(".", archive_entry_pathname(ae));
			assertEqualInt(AE_IFDIR, archive_entry_filetype(ae));
		}
		/*
		 * Read and verify the file.
		 */
		assertEqualIntA(a, ARCHIVE_OK, archive_read_next_header(a, &ae));
		assertEqualInt(1, archive_entry_mtime(ae));
		if (dot_stored & 2) {
			assertEqualString("./file", archive_entry_pathname(ae));
		} else {
			assertEqualString("file", archive_entry_pathname(ae));
		}
		assertEqualInt(AE_IFREG, archive_entry_filetype(ae));
		assertEqualInt(8, archive_entry_size(ae));

		/* Verify the end of the archive. */
		assertEqualIntA(a, ARCHIVE_EOF, archive_read_next_header(a, &ae));

		/* Verify archive format. */
		assertEqualIntA(a, ARCHIVE_FILTER_NONE,
		    archive_filter_code(a, 0));
		assertEqualIntA(a, format_id, archive_format(a));

		assertEqualInt(ARCHIVE_OK, archive_read_close(a));
		assertEqualInt(ARCHIVE_OK, archive_read_free(a));
	}
	free(buff);
}